

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::ShapeHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,ShapeHandle *this)

{
  ulong uVar1;
  uint uVar2;
  Sphere *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  this_00 = (Sphere *)(uVar1 & 0xffffffffffff);
  if (this_00 == (Sphere *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else {
    uVar2 = (uint)(ushort)(uVar1 >> 0x30);
    if (uVar1 >> 0x32 == 0) {
      if (uVar1 >> 0x31 == 0) {
        Sphere::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      else if (uVar2 == 2) {
        Cylinder::ToString_abi_cxx11_(__return_storage_ptr__,(Cylinder *)this_00);
      }
      else {
        Disk::ToString_abi_cxx11_(__return_storage_ptr__,(Disk *)this_00);
      }
    }
    else {
      uVar2 = uVar2 - 3;
      if (uVar2 < 2) {
        Triangle::ToString_abi_cxx11_(__return_storage_ptr__,(Triangle *)this_00);
      }
      else if (uVar2 == 2) {
        BilinearPatch::ToString_abi_cxx11_(__return_storage_ptr__,(BilinearPatch *)this_00);
      }
      else {
        Curve::ToString_abi_cxx11_(__return_storage_ptr__,(Curve *)this_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ShapeHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto tostr = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(tostr);
}